

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bcj2.c
# Opt level: O0

SRes Bcj2Dec_Decode(CBcj2Dec *p)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  undefined1 *puVar7;
  int *piVar8;
  SizeT SVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  long lVar13;
  ushort *puVar14;
  ulong uVar15;
  undefined4 uVar16;
  SizeT *in_RDI;
  Byte *dest;
  uint local_94;
  ulong local_80;
  SizeT i;
  SizeT rem;
  Byte *dest_2;
  Byte *cur;
  uint cj;
  UInt32 val;
  Byte prev;
  Byte b_1;
  UInt16 *prob;
  byte *pbStack_30;
  UInt32 ttt;
  UInt32 bound;
  Byte b;
  SizeT num;
  Byte *dest_1;
  Byte *srcLim;
  Byte *src;
  
  if (*(uint *)((long)in_RDI + 0x5c) < 6) {
    *(undefined4 *)(in_RDI + 10) = 9;
    while (*(int *)((long)in_RDI + 0x5c) != 5) {
      if ((*(int *)((long)in_RDI + 0x5c) == 1) && ((int)in_RDI[0xc] != 0)) {
        return 1;
      }
      if (in_RDI[3] == in_RDI[7]) {
        *(undefined4 *)(in_RDI + 10) = 3;
        return 0;
      }
      pbVar12 = (byte *)in_RDI[3];
      in_RDI[3] = (SizeT)(pbVar12 + 1);
      *(uint *)(in_RDI + 0xc) = (int)in_RDI[0xc] << 8 | (uint)*pbVar12;
      *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) + 1;
    }
    if ((int)in_RDI[0xc] == -1) {
      return 1;
    }
    *(undefined4 *)((long)in_RDI + 0x5c) = 0xffffffff;
  }
  else if (3 < (uint)in_RDI[10]) {
    while ((uint)in_RDI[10] < 8) {
      puVar7 = (undefined1 *)in_RDI[8];
      if (puVar7 == (undefined1 *)in_RDI[9]) {
        return 0;
      }
      SVar9 = in_RDI[10];
      *(int *)(in_RDI + 10) = (int)SVar9 + 1;
      *puVar7 = *(undefined1 *)((long)in_RDI + (ulong)((int)SVar9 - 4) + 0x58);
      in_RDI[8] = (SizeT)(puVar7 + 1);
    }
  }
  do {
    while (((int)in_RDI[10] != 1 && ((int)in_RDI[10] != 2))) {
      if (*(uint *)((long)in_RDI + 0x5c) < 0x1000000) {
        if (in_RDI[3] == in_RDI[7]) {
          *(undefined4 *)(in_RDI + 10) = 3;
          return 0;
        }
        *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) << 8;
        pbVar12 = (byte *)in_RDI[3];
        in_RDI[3] = (SizeT)(pbVar12 + 1);
        *(uint *)(in_RDI + 0xc) = (int)in_RDI[0xc] << 8 | (uint)*pbVar12;
      }
      num = *in_RDI;
      prob = (UInt16 *)(in_RDI[4] - num);
      if (prob == (UInt16 *)0x0) {
        *(undefined4 *)(in_RDI + 10) = 0;
        return 0;
      }
      pbStack_30 = (byte *)in_RDI[8];
      if (((UInt16 *)(in_RDI[9] - (long)pbStack_30) < prob) &&
         (prob = (UInt16 *)(in_RDI[9] - (long)pbStack_30), prob == (UInt16 *)0x0)) {
        *(undefined4 *)(in_RDI + 10) = 8;
        return 0;
      }
      pbVar12 = (byte *)(num + (long)prob);
      if ((*(char *)((long)in_RDI + 0x5b) == '\x0f') && ((*(byte *)num & 0xf0) == 0x80)) {
        *pbStack_30 = *(byte *)num;
      }
      else {
        do {
          while( true ) {
            bVar2 = *(byte *)num;
            *pbStack_30 = bVar2;
            if (bVar2 == 0xf) break;
            if ((bVar2 & 0xfe) == 0xe8) goto LAB_008962b6;
            pbStack_30 = pbStack_30 + 1;
            num = num + 1;
            if ((byte *)num == pbVar12) goto LAB_008962b6;
          }
          pbStack_30 = pbStack_30 + 1;
          num = num + 1;
          if ((byte *)num == pbVar12) goto LAB_008962b6;
        } while ((*(byte *)num & 0xf0) != 0x80);
        *pbStack_30 = *(byte *)num;
      }
LAB_008962b6:
      lVar13 = num - *in_RDI;
      if ((byte *)num == pbVar12) {
        *(undefined1 *)((long)in_RDI + 0x5b) = *(undefined1 *)(num - 1);
        *in_RDI = num;
        *(int *)((long)in_RDI + 0x54) = (int)lVar13 + *(int *)((long)in_RDI + 0x54);
        in_RDI[8] = lVar13 + in_RDI[8];
        uVar16 = 8;
        if (*in_RDI == in_RDI[4]) {
          uVar16 = 0;
        }
        *(undefined4 *)(in_RDI + 10) = uVar16;
        return 0;
      }
      cVar1 = *(char *)num;
      if (lVar13 == 0) {
        bVar2 = *(byte *)((long)in_RDI + 0x5b);
      }
      else {
        bVar2 = *(byte *)(num - 1);
      }
      *(char *)((long)in_RDI + 0x5b) = cVar1;
      *in_RDI = num + 1;
      *(int *)((long)in_RDI + 0x54) = (int)(lVar13 + 1) + *(int *)((long)in_RDI + 0x54);
      in_RDI[8] = lVar13 + 1 + in_RDI[8];
      if (cVar1 == -0x18) {
        local_94 = bVar2 + 2;
      }
      else {
        local_94 = (uint)(cVar1 == -0x17);
      }
      puVar14 = (ushort *)((long)in_RDI + (ulong)local_94 * 2 + 100);
      uVar6 = *puVar14;
      uVar10 = (*(uint *)((long)in_RDI + 0x5c) >> 0xb) * (uint)uVar6;
      if (uVar10 <= (uint)in_RDI[0xc]) {
        *(uint *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) - uVar10;
        *(uint *)(in_RDI + 0xc) = (int)in_RDI[0xc] - uVar10;
        *puVar14 = uVar6 - (uVar6 >> 5);
        goto LAB_008964be;
      }
      *(uint *)((long)in_RDI + 0x5c) = uVar10;
      *puVar14 = uVar6 + (short)(0x800 - uVar6 >> 5);
    }
    *(undefined4 *)(in_RDI + 10) = 9;
LAB_008964be:
    uVar10 = 2;
    if (*(char *)((long)in_RDI + 0x5b) == -0x18) {
      uVar10 = 1;
    }
    pbVar12 = (byte *)in_RDI[uVar10];
    if (pbVar12 == (byte *)in_RDI[(ulong)uVar10 + 4]) {
      *(uint *)(in_RDI + 10) = uVar10;
      goto LAB_00896654;
    }
    bVar2 = *pbVar12;
    bVar3 = pbVar12[1];
    bVar4 = pbVar12[2];
    bVar5 = pbVar12[3];
    in_RDI[uVar10] = (SizeT)(pbVar12 + 4);
    *(int *)((long)in_RDI + 0x54) = *(int *)((long)in_RDI + 0x54) + 4;
    iVar11 = ((uint)bVar2 << 0x18 | (uint)bVar3 << 0x10 | (uint)bVar4 << 8 | (uint)bVar5) -
             *(int *)((long)in_RDI + 0x54);
    piVar8 = (int *)in_RDI[8];
    uVar15 = in_RDI[9] - (long)piVar8;
    if (uVar15 < 4) {
      *(int *)(in_RDI + 0xb) = iVar11;
      for (local_80 = 0; local_80 < uVar15; local_80 = local_80 + 1) {
        *(undefined1 *)((long)piVar8 + local_80) = *(undefined1 *)((long)in_RDI + local_80 + 0x58);
      }
      in_RDI[8] = (long)piVar8 + uVar15;
      *(int *)(in_RDI + 10) = (int)uVar15 + 4;
LAB_00896654:
      if ((*(uint *)((long)in_RDI + 0x5c) < 0x1000000) && (in_RDI[3] != in_RDI[7])) {
        *(int *)((long)in_RDI + 0x5c) = *(int *)((long)in_RDI + 0x5c) << 8;
        pbVar12 = (byte *)in_RDI[3];
        in_RDI[3] = (SizeT)(pbVar12 + 1);
        *(uint *)(in_RDI + 0xc) = (int)in_RDI[0xc] << 8 | (uint)*pbVar12;
      }
      return 0;
    }
    *piVar8 = iVar11;
    *(char *)((long)in_RDI + 0x5b) = (char)((uint)iVar11 >> 0x18);
    in_RDI[8] = (SizeT)(piVar8 + 1);
  } while( true );
}

Assistant:

SRes Bcj2Dec_Decode(CBcj2Dec *p)
{
  if (p->range <= 5)
  {
    p->state = BCJ2_DEC_STATE_OK;
    for (; p->range != 5; p->range++)
    {
      if (p->range == 1 && p->code != 0)
        return SZ_ERROR_DATA;
      
      if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
      {
        p->state = BCJ2_STREAM_RC;
        return SZ_OK;
      }

      p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
    }
    
    if (p->code == 0xFFFFFFFF)
      return SZ_ERROR_DATA;
    
    p->range = 0xFFFFFFFF;
  }
  else if (p->state >= BCJ2_DEC_STATE_ORIG_0)
  {
    while (p->state <= BCJ2_DEC_STATE_ORIG_3)
    {
      Byte *dest = p->dest;
      if (dest == p->destLim)
        return SZ_OK;
      *dest = p->temp[p->state++ - BCJ2_DEC_STATE_ORIG_0];
      p->dest = dest + 1;
    }
  }

  /*
  if (BCJ2_IS_32BIT_STREAM(p->state))
  {
    const Byte *cur = p->bufs[p->state];
    if (cur == p->lims[p->state])
      return SZ_OK;
    p->bufs[p->state] = cur + 4;
    
    {
      UInt32 val;
      Byte *dest;
      SizeT rem;
      
      p->ip += 4;
      val = GetBe32(cur) - p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        return SZ_OK;
      }
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
      p->state = BCJ2_DEC_STATE_OK;
    }
  }
  */

  for (;;)
  {
    if (BCJ2_IS_32BIT_STREAM(p->state))
      p->state = BCJ2_DEC_STATE_OK;
    else
    {
      if (p->range < kTopValue)
      {
        if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
        {
          p->state = BCJ2_STREAM_RC;
          return SZ_OK;
        }
        p->range <<= 8;
        p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
      }

      {
        const Byte *src = p->bufs[BCJ2_STREAM_MAIN];
        const Byte *srcLim;
        Byte *dest;
        SizeT num = p->lims[BCJ2_STREAM_MAIN] - src;
        
        if (num == 0)
        {
          p->state = BCJ2_STREAM_MAIN;
          return SZ_OK;
        }
        
        dest = p->dest;
        if (num > (SizeT)(p->destLim - dest))
        {
          num = p->destLim - dest;
          if (num == 0)
          {
            p->state = BCJ2_DEC_STATE_ORIG;
            return SZ_OK;
          }
        }
       
        srcLim = src + num;

        if (p->temp[3] == 0x0F && (src[0] & 0xF0) == 0x80)
          *dest = src[0];
        else for (;;)
        {
          Byte b = *src;
          *dest = b;
          if (b != 0x0F)
          {
            if ((b & 0xFE) == 0xE8)
              break;
            dest++;
            if (++src != srcLim)
              continue;
            break;
          }
          dest++;
          if (++src == srcLim)
            break;
          if ((*src & 0xF0) != 0x80)
            continue;
          *dest = *src;
          break;
        }
        
        num = src - p->bufs[BCJ2_STREAM_MAIN];
        
        if (src == srcLim)
        {
          p->temp[3] = src[-1];
          p->bufs[BCJ2_STREAM_MAIN] = src;
          p->ip += (UInt32)num;
          p->dest += num;
          p->state =
            p->bufs[BCJ2_STREAM_MAIN] ==
            p->lims[BCJ2_STREAM_MAIN] ?
              (unsigned)BCJ2_STREAM_MAIN :
              (unsigned)BCJ2_DEC_STATE_ORIG;
          return SZ_OK;
        }
        
        {
          UInt32 bound, ttt;
          CProb *prob;
          Byte b = src[0];
          Byte prev = (Byte)(num == 0 ? p->temp[3] : src[-1]);
          
          p->temp[3] = b;
          p->bufs[BCJ2_STREAM_MAIN] = src + 1;
          num++;
          p->ip += (UInt32)num;
          p->dest += num;
          
          prob = p->probs + (unsigned)(b == 0xE8 ? 2 + (unsigned)prev : (b == 0xE9 ? 1 : 0));
          
          _IF_BIT_0
          {
            _UPDATE_0
            continue;
          }
          _UPDATE_1
            
        }
      }
    }

    {
      UInt32 val;
      unsigned cj = (p->temp[3] == 0xE8) ? BCJ2_STREAM_CALL : BCJ2_STREAM_JUMP;
      const Byte *cur = p->bufs[cj];
      Byte *dest;
      SizeT rem;
      
      if (cur == p->lims[cj])
      {
        p->state = cj;
        break;
      }
      
      val = GetBe32(cur);
      p->bufs[cj] = cur + 4;

      p->ip += 4;
      val -= p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        break;
      }
      
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
    }
  }

  if (p->range < kTopValue && p->bufs[BCJ2_STREAM_RC] != p->lims[BCJ2_STREAM_RC])
  {
    p->range <<= 8;
    p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
  }

  return SZ_OK;
}